

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testReader.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_1c;
  int files;
  int i;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    usage(*argv);
    argv_local._4_4_ = 1;
  }
  else {
    xmlCheckVersion(0x33072);
    for (local_1c = 1; local_1c < argc; local_1c = local_1c + 1) {
      iVar1 = strcmp(argv[local_1c],"-debug");
      if ((iVar1 == 0) || (iVar1 = strcmp(argv[local_1c],"--debug"), iVar1 == 0)) {
        debug = debug + 1;
      }
      else {
        iVar1 = strcmp(argv[local_1c],"-dump");
        if ((iVar1 == 0) || (iVar1 = strcmp(argv[local_1c],"--dump"), iVar1 == 0)) {
          dump = dump + 1;
        }
        else {
          iVar1 = strcmp(argv[local_1c],"-count");
          if ((iVar1 == 0) || (iVar1 = strcmp(argv[local_1c],"--count"), iVar1 == 0)) {
            count = count + 1;
          }
          else {
            iVar1 = strcmp(argv[local_1c],"-consumed");
            if ((iVar1 == 0) || (iVar1 = strcmp(argv[local_1c],"--consumed"), iVar1 == 0)) {
              consumed = consumed + 1;
            }
            else {
              iVar1 = strcmp(argv[local_1c],"-valid");
              if ((iVar1 == 0) || (iVar1 = strcmp(argv[local_1c],"--valid"), iVar1 == 0)) {
                valid = valid + 1;
              }
              else {
                iVar1 = strcmp(argv[local_1c],"-noent");
                if ((iVar1 == 0) || (iVar1 = strcmp(argv[local_1c],"--noent"), iVar1 == 0)) {
                  noent = noent + 1;
                }
              }
            }
          }
        }
      }
    }
    if (noent != 0) {
      xmlSubstituteEntitiesDefault(1);
    }
    for (local_1c = 1; local_1c < argc; local_1c = local_1c + 1) {
      if (*argv[local_1c] != '-') {
        handleFile(argv[local_1c]);
      }
    }
    xmlCleanupParser();
    xmlMemoryDump();
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int files = 0;

    if (argc <= 1) {
	usage(argv[0]);
	return(1);
    }
    LIBXML_TEST_VERSION
    for (i = 1; i < argc ; i++) {
	if ((!strcmp(argv[i], "-debug")) || (!strcmp(argv[i], "--debug")))
	    debug++;
	else if ((!strcmp(argv[i], "-dump")) || (!strcmp(argv[i], "--dump")))
	    dump++;
	else if ((!strcmp(argv[i], "-count")) || (!strcmp(argv[i], "--count")))
	    count++;
	else if ((!strcmp(argv[i], "-consumed")) || (!strcmp(argv[i], "--consumed")))
	    consumed++;
	else if ((!strcmp(argv[i], "-valid")) || (!strcmp(argv[i], "--valid")))
	    valid++;
	else if ((!strcmp(argv[i], "-noent")) ||
	         (!strcmp(argv[i], "--noent")))
	    noent++;
    }
    if (noent != 0) xmlSubstituteEntitiesDefault(1);
    for (i = 1; i < argc ; i++) {
	if (argv[i][0] != '-') {
	    handleFile(argv[i]);
	    files ++;
	}
    }
    xmlCleanupParser();
    xmlMemoryDump();

    return(0);
}